

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O1

mbedtls_ct_condition_t
mbedtls_mpi_core_uint_le_mpi(mbedtls_mpi_uint min,mbedtls_mpi_uint *A,size_t A_limbs)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  
  uVar1 = *A ^ min;
  uVar2 = 0;
  if (1 < A_limbs) {
    sVar3 = 1;
    do {
      uVar2 = uVar2 | (long)(-A[sVar3] | A[sVar3]) >> 0x3f;
      sVar3 = sVar3 + 1;
    } while (A_limbs != sVar3);
  }
  return ~((long)(*A - min & ~uVar1 | min & uVar1) >> 0x3f) | uVar2;
}

Assistant:

mbedtls_ct_condition_t mbedtls_mpi_core_uint_le_mpi(mbedtls_mpi_uint min,
                                                    const mbedtls_mpi_uint *A,
                                                    size_t A_limbs)
{
    /* min <= least significant limb? */
    mbedtls_ct_condition_t min_le_lsl = mbedtls_ct_uint_ge(A[0], min);

    /* limbs other than the least significant one are all zero? */
    mbedtls_ct_condition_t msll_mask = MBEDTLS_CT_FALSE;
    for (size_t i = 1; i < A_limbs; i++) {
        msll_mask = mbedtls_ct_bool_or(msll_mask, mbedtls_ct_bool(A[i]));
    }

    /* min <= A iff the lowest limb of A is >= min or the other limbs
     * are not all zero. */
    return mbedtls_ct_bool_or(msll_mask, min_le_lsl);
}